

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters cPar;
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined4 in_stack_ffffffffffffff54;
  ZSTD_strategy ZVar2;
  undefined4 uStack_a4;
  undefined1 local_58 [24];
  ZSTD_strategy local_40;
  undefined1 local_3c [8];
  ZSTD_compressionParameters cParams;
  size_t dictSize_local;
  U64 srcSizeHint_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  ZVar2 = (ZSTD_strategy)__return_storage_ptr__;
  uStack_a4 = (undefined4)((ulong)__return_storage_ptr__ >> 0x20);
  dictSize_local = srcSizeHint;
  if ((srcSizeHint == 0xffffffffffffffff) && (0 < CCtxParams->srcSizeHint)) {
    dictSize_local = (size_t)CCtxParams->srcSizeHint;
  }
  cParams._20_8_ = dictSize;
  ZSTD_getCParams_internal
            ((ZSTD_compressionParameters *)local_58,CCtxParams->compressionLevel,dictSize_local,
             dictSize);
  local_3c = (undefined1  [8])local_58._0_8_;
  cParams.windowLog = local_58._8_4_;
  cParams.chainLog = local_58._12_4_;
  cParams.hashLog = local_58._16_4_;
  cParams.searchLog = local_58._20_4_;
  cParams.minMatch = local_40;
  if ((CCtxParams->ldmParams).enableLdm != 0) {
    local_3c._4_4_ = SUB84(local_58._0_8_,4);
    local_3c._0_4_ = 0x1b;
  }
  if ((CCtxParams->cParams).windowLog != 0) {
    local_3c._0_4_ = (CCtxParams->cParams).windowLog;
  }
  if ((CCtxParams->cParams).hashLog != 0) {
    cParams.chainLog = SUB84(local_58._8_8_,4);
    cParams.windowLog = (CCtxParams->cParams).hashLog;
  }
  if ((CCtxParams->cParams).chainLog != 0) {
    local_3c._4_4_ = (CCtxParams->cParams).chainLog;
  }
  if ((CCtxParams->cParams).searchLog != 0) {
    cParams.chainLog = (CCtxParams->cParams).searchLog;
  }
  if ((CCtxParams->cParams).minMatch != 0) {
    cParams.searchLog = SUB84(local_58._16_8_,4);
    cParams.hashLog = (CCtxParams->cParams).minMatch;
  }
  if ((CCtxParams->cParams).targetLength != 0) {
    cParams.searchLog = (CCtxParams->cParams).targetLength;
  }
  if ((CCtxParams->cParams).strategy != 0) {
    cParams.minMatch = (CCtxParams->cParams).strategy;
  }
  cParams_00.hashLog = cParams.hashLog;
  cParams_00.searchLog = cParams.searchLog;
  cParams_00.windowLog = cParams.windowLog;
  cParams_00.chainLog = cParams.chainLog;
  cParams_00.minMatch = cParams.minMatch;
  cParams_00.targetLength = in_stack_ffffffffffffff54;
  cParams_00.strategy = ZVar2;
  sVar1 = ZSTD_checkCParams(cParams_00);
  if (sVar1 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2e86,
                  "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t)"
                 );
  }
  cPar.hashLog = cParams.windowLog;
  cPar.searchLog = cParams.chainLog;
  cPar.windowLog = local_3c._0_4_;
  cPar.chainLog = local_3c._4_4_;
  cPar.minMatch = cParams.hashLog;
  cPar.targetLength = cParams.searchLog;
  cPar.strategy = cParams.minMatch;
  ZSTD_adjustCParams_internal
            ((ZSTD_compressionParameters *)CONCAT44(uStack_a4,ZVar2),cPar,dictSize_local,
             cParams._20_8_);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}